

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

void Ses_StoreWrite(Ses_Store_t *pStore,char *pFilename,int fSynthImp,int fSynthRL,int fUnsynthImp,
                   int fUnsynthRL)

{
  Ses_TimesEntry_t *__ptr;
  char *__ptr_00;
  FILE *__s;
  long lVar1;
  Ses_TimesEntry_t **ppSVar2;
  Ses_TruthEntry_t *__ptr_01;
  unsigned_long local_38;
  
  __s = fopen(pFilename,"wb");
  if (__s != (FILE *)0x0) {
    local_38 = pStore->nSynthesizedImp;
    fwrite(&local_38,8,1,__s);
    for (lVar1 = 0; lVar1 != 0x400; lVar1 = lVar1 + 1) {
      __ptr_01 = pStore->pEntries[lVar1];
      if (__ptr_01 != (Ses_TruthEntry_t *)0x0) {
        for (; __ptr_01 != (Ses_TruthEntry_t *)0x0; __ptr_01 = __ptr_01->next) {
          ppSVar2 = &__ptr_01->head;
          while (__ptr = *ppSVar2, __ptr != (Ses_TimesEntry_t *)0x0) {
            if ((__ptr->pNetwork != (char *)0x0) && (__ptr->fResLimit == 0)) {
              fwrite(__ptr_01,8,4,__s);
              fwrite(&__ptr_01->nVars,4,1,__s);
              fwrite(__ptr,4,8,__s);
              fwrite(&__ptr->fResLimit,4,1,__s);
              __ptr_00 = __ptr->pNetwork;
              if (__ptr_00 == (char *)0x0) {
                fputc(0,__s);
                fputc(0,__s);
                fputc(0,__s);
              }
              else {
                fwrite(__ptr_00,1,(long)*__ptr_00 + (long)__ptr_00[2] * 4 + 5,__s);
              }
            }
            ppSVar2 = &__ptr->next;
          }
        }
      }
    }
    fclose(__s);
    return;
  }
  printf("cannot open file \"%s\" for writing\n",pFilename);
  return;
}

Assistant:

static void Ses_StoreWrite( Ses_Store_t * pStore, const char * pFilename, int fSynthImp, int fSynthRL, int fUnsynthImp, int fUnsynthRL )
{
    int i;
    char zero = '\0';
    unsigned long nEntries = 0;
    Ses_TruthEntry_t * pTEntry;
    Ses_TimesEntry_t * pTiEntry;
    FILE * pFile;

    pFile = fopen( pFilename, "wb" );
    if (pFile == NULL)
    {
        printf( "cannot open file \"%s\" for writing\n", pFilename );
        return;
    }

    if ( fSynthImp )   nEntries += pStore->nSynthesizedImp;
    if ( fSynthRL )    nEntries += pStore->nSynthesizedRL;
    if ( fUnsynthImp ) nEntries += pStore->nUnsynthesizedImp;
    if ( fUnsynthRL )  nEntries += pStore->nUnsynthesizedRL;
    fwrite( &nEntries, sizeof( unsigned long ), 1, pFile );

    for ( i = 0; i < SES_STORE_TABLE_SIZE; ++i )
        if ( pStore->pEntries[i] )
        {
            pTEntry = pStore->pEntries[i];

            while ( pTEntry )
            {
                pTiEntry = pTEntry->head;
                while ( pTiEntry )
                {
                    if ( !fSynthImp && pTiEntry->pNetwork && !pTiEntry->fResLimit )    { pTiEntry = pTiEntry->next; continue; }
                    if ( !fSynthRL && pTiEntry->pNetwork && pTiEntry->fResLimit )      { pTiEntry = pTiEntry->next; continue; }
                    if ( !fUnsynthImp && !pTiEntry->pNetwork && !pTiEntry->fResLimit ) { pTiEntry = pTiEntry->next; continue; }
                    if ( !fUnsynthRL && !pTiEntry->pNetwork && pTiEntry->fResLimit )   { pTiEntry = pTiEntry->next; continue; }

                    fwrite( pTEntry->pTruth, sizeof( word ), 4, pFile );
                    fwrite( &pTEntry->nVars, sizeof( int ), 1, pFile );
                    fwrite( pTiEntry->pArrTimeProfile, sizeof( int ), 8, pFile );
                    fwrite( &pTiEntry->fResLimit, sizeof( int ), 1, pFile );

                    if ( pTiEntry->pNetwork )
                    {
                        fwrite( pTiEntry->pNetwork, sizeof( char ), 3 + 4 * pTiEntry->pNetwork[ABC_EXACT_SOL_NGATES] + 2 + pTiEntry->pNetwork[ABC_EXACT_SOL_NVARS], pFile );
                    }
                    else
                    {
                        fwrite( &zero, sizeof( char ), 1, pFile );
                        fwrite( &zero, sizeof( char ), 1, pFile );
                        fwrite( &zero, sizeof( char ), 1, pFile );
                    }

                    pTiEntry = pTiEntry->next;
                }
                pTEntry = pTEntry->next;
            }
        }


    fclose( pFile );
}